

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_array_scan_state.cpp
# Opt level: O1

void __thiscall
duckdb::ArrowArrayScanState::ArrowArrayScanState
          (ArrowArrayScanState *this,ArrowScanLocalState *state,ClientContext *context)

{
  this->state = state;
  (this->owned_data).internal.
  super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->owned_data).internal.
  super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->children)._M_h._M_buckets = &(this->children)._M_h._M_single_bucket;
  (this->children)._M_h._M_bucket_count = 1;
  (this->children)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->children)._M_h._M_element_count = 0;
  (this->children)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arrow_dictionary).ptr = (ArrowArray *)0x0;
  (this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  (this->children)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->children)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->run_end_encoding).run_ends.
  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false> = (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0;
  (this->run_end_encoding).values.
  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  this->context = context;
  (this->arrow_dictionary).ptr = (ArrowArray *)0x0;
  return;
}

Assistant:

ArrowArrayScanState::ArrowArrayScanState(ArrowScanLocalState &state, ClientContext &context)
    : state(state), context(context) {
	arrow_dictionary = nullptr;
}